

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O0

void __thiscall tst_InsertProxyModel::testSourceInsertRow(tst_InsertProxyModel *this)

{
  uint uVar1;
  int iVar2;
  QObject *pQVar3;
  QAbstractItemModel *this_00;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  Int IVar8;
  int iVar9;
  uint uVar10;
  undefined8 *puVar11;
  Int *pIVar12;
  uint *puVar13;
  byte *pbVar14;
  ModelTest *this_01;
  QVariant local_cb8;
  QModelIndex local_c98;
  QModelIndex local_c80;
  QModelIndex local_c68;
  QVariant local_c50;
  QModelIndex local_c30;
  uint local_c14;
  undefined1 local_c10 [4];
  int i_4;
  QString local_bf8;
  QModelIndex local_be0;
  QModelIndex local_bc8;
  QVariant local_bb0;
  QString local_b90;
  QArrayDataPointer<char16_t> local_b78;
  QString local_b60;
  QModelIndex local_b48;
  QModelIndex local_b30;
  QVariant local_b18;
  QString local_af8;
  Int local_adc;
  QVariant local_ad8;
  QModelIndex local_ab8;
  QModelIndex local_aa0;
  QModelIndex local_a88;
  QVariant local_a70;
  QModelIndex local_a50;
  int local_a34;
  undefined1 local_a30 [4];
  int i_3;
  QString local_a18;
  QModelIndex local_a00;
  QModelIndex local_9e8;
  QVariant local_9d0;
  QString local_9b0;
  Int local_994;
  QModelIndex local_990;
  QModelIndex local_978;
  QVariant local_960;
  QModelIndex local_940;
  QModelIndex local_928;
  QVariant local_910;
  Int local_8f0;
  int local_8ec;
  Int local_8e8;
  int j_3;
  Int local_8e0;
  int i_2;
  Int local_8d8;
  bool local_8d2;
  bool local_8d1;
  QArrayDataPointer<char16_t> local_8d0;
  QString local_8b8;
  QModelIndex local_8a0;
  QModelIndex local_888;
  QVariant local_870;
  QString local_850;
  QArrayDataPointer<char16_t> local_838;
  QString local_820;
  QModelIndex local_808;
  QModelIndex local_7f0;
  QVariant local_7d8;
  QString local_7b8;
  Int local_79c;
  QModelIndex local_798;
  QModelIndex local_780;
  QVariant local_768;
  QModelIndex local_748;
  QModelIndex local_730;
  QVariant local_718;
  int local_6f4;
  int j_2;
  QModelIndex local_6d8;
  QVariant local_6c0;
  QModelIndex local_6a0;
  QModelIndex local_688;
  QVariant local_670;
  int local_64c;
  uint local_648;
  int j_1;
  int i_1;
  Int local_624;
  QModelIndex local_620;
  QModelIndex local_608;
  QModelIndex local_5f0;
  QVariant local_5d8;
  QVariant local_5b8;
  QVariant local_598;
  QModelIndex local_578;
  undefined1 local_560 [8];
  QList<QVariant> args;
  qsizetype local_540;
  qint32 local_534;
  qsizetype local_530;
  QModelIndex local_528;
  QModelIndex local_510;
  QModelIndex local_4f8;
  QModelIndex local_4e0;
  QVariant local_4c8;
  QModelIndex local_4a8;
  QModelIndex local_490;
  QVariant local_478;
  int local_458;
  uint local_454;
  int j;
  int i;
  QString local_438;
  QVariant local_420;
  QModelIndex local_400;
  undefined1 local_3e8 [24];
  QArrayDataPointer<char16_t> local_3d0;
  QString local_3b8;
  QVariant local_3a0;
  QModelIndex local_380;
  undefined1 local_368 [28];
  Int local_34c;
  QModelIndex local_348;
  QModelIndex local_330;
  QArrayDataPointer<char16_t> local_318;
  QString local_300;
  QVariant local_2e8;
  QModelIndex local_2c8;
  undefined1 local_2b0 [24];
  Int local_298;
  Int local_294;
  QModelIndex local_290;
  Int local_274;
  QModelIndex local_270;
  QModelIndex local_258;
  uint local_23c;
  int originalRowCount;
  int local_21c;
  undefined1 local_218 [4];
  int originalColCount;
  QSignalSpy baseRowsInsertedSpy;
  undefined1 local_190 [8];
  QSignalSpy proxyRowsInsertedSpy;
  InsertProxyModel local_100 [8];
  InsertProxyModel proxy;
  QFlags<InsertProxyModel::InsertDirection> QStack_dc;
  bool addViaProxy;
  int indexToInsert;
  InsertDirections insertDirection;
  QAbstractItemModel *baseModel;
  tst_InsertProxyModel *this_local;
  char16_t *str_5;
  char16_t *str;
  char16_t *str_7;
  char16_t *str_4;
  char16_t *str_1;
  char16_t *str_6;
  char16_t *str_3;
  char16_t *str_2;
  
  iVar7 = qMetaTypeId<QAbstractItemModel*>();
  puVar11 = (undefined8 *)QTest::qData("baseModel",iVar7);
  _indexToInsert = (QObject *)*puVar11;
  iVar7 = qMetaTypeId<QFlags<InsertProxyModel::InsertDirection>>();
  pIVar12 = (Int *)QTest::qData("insertDirection",iVar7);
  QStack_dc.i = *pIVar12;
  iVar7 = qMetaTypeId<int>();
  puVar13 = (uint *)QTest::qData("indexToInsert",iVar7);
  uVar1 = *puVar13;
  iVar7 = qMetaTypeId<bool>();
  pbVar14 = (byte *)QTest::qData("addViaProxy",iVar7);
  bVar6 = *pbVar14;
  InsertProxyModel::InsertProxyModel(local_100,(QObject *)0x0);
  this_01 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_01,(QAbstractItemModel *)local_100,_indexToInsert);
  InsertProxyModel::setSourceModel((QAbstractItemModel *)local_100);
  InsertProxyModel::setInsertDirection((QFlags_conflict1 *)local_100);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_190,(QObject *)local_100,"2rowsInserted(QModelIndex, int, int)");
  bVar4 = QSignalSpy::isValid((QSignalSpy *)local_190);
  bVar5 = QTest::qVerify(bVar4,"proxyRowsInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x148);
  if ((bVar5 & 1) == 0) {
    baseRowsInsertedSpy._124_4_ = 1;
    goto LAB_00114bb2;
  }
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_218,_indexToInsert,"2rowsInserted(QModelIndex, int, int)");
  bVar4 = QSignalSpy::isValid((QSignalSpy *)local_218);
  bVar5 = QTest::qVerify(bVar4,"baseRowsInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x14a);
  pQVar3 = _indexToInsert;
  if ((bVar5 & 1) == 0) {
    baseRowsInsertedSpy._124_4_ = 1;
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)&stack0xfffffffffffffdc8);
    local_21c = (**(code **)(*(long *)pQVar3 + 0x80))
                          (pQVar3,(QModelIndex *)&stack0xfffffffffffffdc8);
    pQVar3 = _indexToInsert;
    QModelIndex::QModelIndex(&local_258);
    local_23c = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_258);
    QModelIndex::QModelIndex(&local_270);
    iVar7 = InsertProxyModel::rowCount((QModelIndex *)local_100);
    uVar10 = local_23c;
    local_274 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                               (&stack0xffffffffffffff24,InsertRow);
    IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_274);
    bVar5 = QTest::qCompare(iVar7,(uVar10 + 1) - (uint)(IVar8 == 0),"proxy.rowCount()",
                            "originalRowCount + bool(insertDirection & InsertProxyModel::InsertRow)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                            ,0x14d);
    if (((bVar5 ^ 0xff) & 1) == 0) {
      QModelIndex::QModelIndex(&local_290);
      iVar9 = InsertProxyModel::columnCount((QModelIndex *)local_100);
      iVar7 = local_21c;
      local_294 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                 (&stack0xffffffffffffff24,InsertColumn);
      IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_294);
      bVar5 = QTest::qCompare(iVar9,(iVar7 + 1) - (uint)(IVar8 == 0),"proxy.columnCount()",
                              "originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                              ,0x14e);
      if (((bVar5 ^ 0xff) & 1) == 0) {
        local_298 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                   (&stack0xffffffffffffff24,InsertRow);
        IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_298);
        uVar10 = local_23c;
        if (IVar8 == 0) {
LAB_001127fc:
          local_34c = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                     (&stack0xffffffffffffff24,InsertColumn);
          IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34c);
          if (IVar8 != 0) {
            if (0 < (int)uVar1) {
              QModelIndex::QModelIndex(&local_380);
              InsertProxyModel::index
                        ((int)local_368,(int)local_100,(QModelIndex *)(ulong)(uVar1 - 1));
              QArrayDataPointer<char16_t>::QArrayDataPointer
                        (&local_3d0,(Data *)0x0,L"TestColumnBefore",0x10);
              QString::QString(&local_3b8,&local_3d0);
              QVariant::QVariant(&local_3a0,&local_3b8);
              bVar5 = InsertProxyModel::setData
                                ((QModelIndex *)local_100,(QVariant *)local_368,(int)&local_3a0);
              bVar5 = QTest::qVerify((bool)(bVar5 & 1),
                                     "proxy.setData(proxy.index(indexToInsert - 1, originalColCount), QStringLiteral(\"TestColumnBefore\"))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                     ,0x155);
              QVariant::~QVariant(&local_3a0);
              QString::~QString(&local_3b8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3d0);
              if (((bVar5 ^ 0xff) & 1) != 0) {
                baseRowsInsertedSpy._124_4_ = 1;
                goto LAB_00114ba6;
              }
            }
            if ((int)uVar1 < (int)local_23c) {
              QModelIndex::QModelIndex(&local_400);
              InsertProxyModel::index((int)local_3e8,(int)local_100,(QModelIndex *)(ulong)uVar1);
              QArrayDataPointer<char16_t>::QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&j,(Data *)0x0,L"TestColumnAfter",0xf);
              QString::QString(&local_438,(DataPointer *)&j);
              QVariant::QVariant(&local_420,&local_438);
              bVar5 = InsertProxyModel::setData
                                ((QModelIndex *)local_100,(QVariant *)local_3e8,(int)&local_420);
              bVar5 = QTest::qVerify((bool)(bVar5 & 1),
                                     "proxy.setData(proxy.index(indexToInsert, originalColCount), QStringLiteral(\"TestColumnAfter\"))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                     ,0x157);
              QVariant::~QVariant(&local_420);
              QString::~QString(&local_438);
              QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&j);
              if (((bVar5 ^ 0xff) & 1) != 0) {
                baseRowsInsertedSpy._124_4_ = 1;
                goto LAB_00114ba6;
              }
            }
          }
          for (local_454 = 0; this_00 = (QAbstractItemModel *)_indexToInsert,
              (int)local_454 < (int)local_23c; local_454 = local_454 + 1) {
            for (local_458 = 0; uVar10 = local_454, local_458 < local_21c; local_458 = local_458 + 1
                ) {
              QModelIndex::QModelIndex(&local_4a8);
              InsertProxyModel::index((int)&local_490,(int)local_100,(QModelIndex *)(ulong)uVar10);
              QModelIndex::data(&local_478,&local_490,0);
              pQVar3 = _indexToInsert;
              uVar10 = local_454;
              iVar7 = local_458;
              QModelIndex::QModelIndex(&local_4f8);
              (**(code **)(*(long *)pQVar3 + 0x60))(&local_4e0,pQVar3,uVar10,iVar7,&local_4f8);
              QModelIndex::data(&local_4c8,&local_4e0,0);
              bVar4 = QTest::qCompare<QVariant,QVariant>
                                (&local_478,&local_4c8,"proxy.index(i, j).data()",
                                 "baseModel->index(i, j).data()",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                 ,0x15b);
              QVariant::~QVariant(&local_4c8);
              QVariant::~QVariant(&local_478);
              if (((bVar4 ^ 0xffU) & 1) != 0) {
                baseRowsInsertedSpy._124_4_ = 1;
                goto LAB_00114ba6;
              }
            }
          }
          if ((bVar6 & 1) == 0) {
            QModelIndex::QModelIndex(&local_528);
            bVar4 = QAbstractItemModel::insertRow(this_00,uVar1,&local_528);
            bVar6 = QTest::qVerify(bVar4,"baseModel->insertRow(indexToInsert)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x161);
            if (((bVar6 ^ 0xff) & 1) == 0) goto LAB_00112f33;
            baseRowsInsertedSpy._124_4_ = 1;
          }
          else {
            QModelIndex::QModelIndex(&local_510);
            bVar4 = QAbstractItemModel::insertRow((QAbstractItemModel *)local_100,uVar1,&local_510);
            bVar6 = QTest::qVerify(bVar4,"proxy.insertRow(indexToInsert)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x15f);
            if (((bVar6 ^ 0xff) & 1) == 0) {
LAB_00112f33:
              local_530 = QList<QList<QVariant>_>::count
                                    ((QList<QList<QVariant>_> *)&baseRowsInsertedSpy.field_0x8);
              local_534 = 1;
              bVar4 = QTest::qCompare<long_long,int>
                                (&local_530,&local_534,"baseRowsInsertedSpy.count()","1",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                 ,0x162);
              if (((bVar4 ^ 0xffU) & 1) == 0) {
                QList<QList<QVariant>_>::clear
                          ((QList<QList<QVariant>_> *)&baseRowsInsertedSpy.field_0x8);
                local_540 = QList<QList<QVariant>_>::count
                                      ((QList<QList<QVariant>_> *)&proxyRowsInsertedSpy.field_0x8);
                args.d.size._4_4_ = 1;
                bVar4 = QTest::qCompare<long_long,int>
                                  (&local_540,(qint32 *)((long)&args.d.size + 4),
                                   "proxyRowsInsertedSpy.count()","1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x164);
                if (((bVar4 ^ 0xffU) & 1) == 0) {
                  QList<QList<QVariant>_>::value
                            ((QList<QVariant> *)local_560,
                             (QList<QList<QVariant>_> *)&proxyRowsInsertedSpy.field_0x8,0);
                  QList<QList<QVariant>_>::clear
                            ((QList<QList<QVariant>_> *)&proxyRowsInsertedSpy.field_0x8);
                  QList<QVariant>::value(&local_598,(QList<QVariant> *)local_560,0);
                  QVariant::value<QModelIndex>(&local_578,&local_598);
                  bVar4 = QModelIndex::isValid(&local_578);
                  bVar6 = QTest::qVerify(!bVar4,"!args.value(0).value<QModelIndex>().isValid()","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x167);
                  QVariant::~QVariant(&local_598);
                  if (((bVar6 ^ 0xff) & 1) == 0) {
                    QList<QVariant>::value(&local_5b8,(QList<QVariant> *)local_560,1);
                    iVar7 = QVariant::toInt((bool *)&local_5b8);
                    bVar6 = QTest::qCompare(iVar7,uVar1,"args.value(1).toInt()","indexToInsert",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                            ,0x168);
                    QVariant::~QVariant(&local_5b8);
                    if (((bVar6 ^ 0xff) & 1) == 0) {
                      QList<QVariant>::value(&local_5d8,(QList<QVariant> *)local_560,2);
                      iVar7 = QVariant::toInt((bool *)&local_5d8);
                      bVar6 = QTest::qCompare(iVar7,uVar1,"args.value(2).toInt()","indexToInsert",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                              ,0x169);
                      QVariant::~QVariant(&local_5d8);
                      pQVar3 = _indexToInsert;
                      if (((bVar6 ^ 0xff) & 1) == 0) {
                        QModelIndex::QModelIndex(&local_5f0);
                        iVar7 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_5f0);
                        bVar6 = QTest::qCompare(iVar7,local_23c + 1,"baseModel->rowCount()",
                                                "originalRowCount + 1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                ,0x16a);
                        pQVar3 = _indexToInsert;
                        if (((bVar6 ^ 0xff) & 1) == 0) {
                          QModelIndex::QModelIndex(&local_608);
                          iVar7 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_608);
                          bVar6 = QTest::qCompare(iVar7,local_21c,"baseModel->columnCount()",
                                                  "originalColCount",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x16b);
                          if (((bVar6 ^ 0xff) & 1) == 0) {
                            QModelIndex::QModelIndex(&local_620);
                            iVar7 = InsertProxyModel::rowCount((QModelIndex *)local_100);
                            uVar10 = local_23c;
                            local_624 = (Int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                                       (&stack0xffffffffffffff24,InsertRow);
                            IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_624);
                            bVar6 = QTest::qCompare(iVar7,(uVar10 - (IVar8 == 0)) + 2,
                                                    "proxy.rowCount()",
                                                                                                        
                                                  "originalRowCount + 1 + bool(insertDirection & InsertProxyModel::InsertRow)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x16c);
                            if (((bVar6 ^ 0xff) & 1) == 0) {
                              QModelIndex::QModelIndex((QModelIndex *)&i_1);
                              iVar9 = InsertProxyModel::columnCount((QModelIndex *)local_100);
                              iVar7 = local_21c;
                              j_1 = (int)QFlags<InsertProxyModel::InsertDirection>::operator&
                                                   (&stack0xffffffffffffff24,InsertColumn);
                              IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&j_1);
                              bVar6 = QTest::qCompare(iVar9,(iVar7 + 1) - (uint)(IVar8 == 0),
                                                      "proxy.columnCount()",
                                                                                                            
                                                  "originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x16d);
                              if (((bVar6 ^ 0xff) & 1) == 0) {
                                for (local_648 = 0; (int)local_648 < (int)(local_23c + 1);
                                    local_648 = local_648 + 1) {
                                  for (local_64c = 0; uVar10 = local_648, local_64c < local_21c;
                                      local_64c = local_64c + 1) {
                                    QModelIndex::QModelIndex(&local_6a0);
                                    InsertProxyModel::index
                                              ((int)&local_688,(int)local_100,
                                               (QModelIndex *)(ulong)uVar10);
                                    QModelIndex::data(&local_670,&local_688,0);
                                    pQVar3 = _indexToInsert;
                                    uVar10 = local_648;
                                    iVar7 = local_64c;
                                    QModelIndex::QModelIndex
                                              ((QModelIndex *)&stack0xfffffffffffff910);
                                    (**(code **)(*(long *)pQVar3 + 0x60))
                                              (&local_6d8,pQVar3,uVar10,iVar7,
                                               (QModelIndex *)&stack0xfffffffffffff910);
                                    QModelIndex::data(&local_6c0,&local_6d8,0);
                                    bVar4 = QTest::qCompare<QVariant,QVariant>
                                                      (&local_670,&local_6c0,
                                                       "proxy.index(i, j).data()",
                                                       "baseModel->index(i, j).data()",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x170);
                                    QVariant::~QVariant(&local_6c0);
                                    QVariant::~QVariant(&local_670);
                                    if (((bVar4 ^ 0xffU) & 1) != 0) {
                                      baseRowsInsertedSpy._124_4_ = 1;
                                      goto LAB_00114b9a;
                                    }
                                  }
                                }
                                for (local_6f4 = 0; local_6f4 < local_21c; local_6f4 = local_6f4 + 1
                                    ) {
                                  QModelIndex::QModelIndex(&local_748);
                                  InsertProxyModel::index
                                            ((int)&local_730,(int)local_100,
                                             (QModelIndex *)(ulong)uVar1);
                                  QModelIndex::data(&local_718,&local_730,0);
                                  bVar6 = QVariant::isNull();
                                  bVar6 = QTest::qVerify((bool)(bVar6 & 1),
                                                                                                                  
                                                  "proxy.index(indexToInsert, j).data().isNull()",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x174);
                                  QVariant::~QVariant(&local_718);
                                  pQVar3 = _indexToInsert;
                                  iVar7 = local_6f4;
                                  if (((bVar6 ^ 0xff) & 1) != 0) {
                                    baseRowsInsertedSpy._124_4_ = 1;
                                    goto LAB_00114b9a;
                                  }
                                  QModelIndex::QModelIndex(&local_798);
                                  (**(code **)(*(long *)pQVar3 + 0x60))
                                            (&local_780,pQVar3,uVar1,iVar7,&local_798);
                                  QModelIndex::data(&local_768,&local_780,0);
                                  bVar6 = QVariant::isNull();
                                  bVar6 = QTest::qVerify((bool)(bVar6 & 1),
                                                                                                                  
                                                  "baseModel->index(indexToInsert, j).data().isNull()"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x175);
                                  QVariant::~QVariant(&local_768);
                                  if (((bVar6 ^ 0xff) & 1) != 0) {
                                    baseRowsInsertedSpy._124_4_ = 1;
                                    goto LAB_00114b9a;
                                  }
                                }
                                local_79c = (Int)QFlags<InsertProxyModel::InsertDirection>::
                                                 operator&(&stack0xffffffffffffff24,InsertColumn);
                                IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_79c);
                                if (IVar8 != 0) {
                                  if ((int)uVar1 < (int)local_23c) {
                                    QModelIndex::QModelIndex(&local_808);
                                    InsertProxyModel::index
                                              ((int)&local_7f0,(int)local_100,
                                               (QModelIndex *)(ulong)(uVar1 + 1));
                                    QModelIndex::data(&local_7d8,&local_7f0,0);
                                    QVariant::toString();
                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                              (&local_838,(Data *)0x0,L"TestColumnAfter",0xf);
                                    QString::QString(&local_820,&local_838);
                                    bVar4 = QTest::qCompare(&local_7b8,&local_820,
                                                                                                                        
                                                  "proxy.index(indexToInsert + 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnAfter\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x179);
                                    QString::~QString(&local_820);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_838);
                                    QString::~QString(&local_7b8);
                                    QVariant::~QVariant(&local_7d8);
                                    if (((bVar4 ^ 0xffU) & 1) != 0) {
                                      baseRowsInsertedSpy._124_4_ = 1;
                                      goto LAB_00114b9a;
                                    }
                                  }
                                  if (0 < (int)uVar1) {
                                    QModelIndex::QModelIndex(&local_8a0);
                                    InsertProxyModel::index
                                              ((int)&local_888,(int)local_100,
                                               (QModelIndex *)(ulong)(uVar1 - 1));
                                    QModelIndex::data(&local_870,&local_888,0);
                                    QVariant::toString();
                                    QArrayDataPointer<char16_t>::QArrayDataPointer
                                              (&local_8d0,(Data *)0x0,L"TestColumnBefore",0x10);
                                    QString::QString(&local_8b8,&local_8d0);
                                    bVar4 = QTest::qCompare(&local_850,&local_8b8,
                                                                                                                        
                                                  "proxy.index(indexToInsert - 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnBefore\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x17b);
                                    QString::~QString(&local_8b8);
                                    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_8d0);
                                    QString::~QString(&local_850);
                                    QVariant::~QVariant(&local_870);
                                    if (((bVar4 ^ 0xffU) & 1) != 0) {
                                      baseRowsInsertedSpy._124_4_ = 1;
                                      goto LAB_00114b9a;
                                    }
                                  }
                                }
                                bVar6 = InsertProxyModel::commitRow();
                                local_8d1 = (bool)(bVar6 & 1);
                                local_8d8 = (Int)QFlags<InsertProxyModel::InsertDirection>::
                                                 operator&(&stack0xffffffffffffff24,InsertRow);
                                IVar8 = QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8d8);
                                local_8d2 = IVar8 != 0;
                                bVar4 = QTest::qCompare<bool,bool>
                                                  (&local_8d1,&local_8d2,"proxy.commitRow()",
                                                                                                      
                                                  "bool(insertDirection & InsertProxyModel::InsertRow)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x17d);
                                if (((bVar4 ^ 0xffU) & 1) == 0) {
                                  bVar6 = InsertProxyModel::commitColumn();
                                  i_2._3_1_ = bVar6 & 1;
                                  local_8e0 = (Int)QFlags<InsertProxyModel::InsertDirection>::
                                                   operator&(&stack0xffffffffffffff24,InsertColumn);
                                  IVar8 = QFlags::operator_cast_to_unsigned_int
                                                    ((QFlags *)&local_8e0);
                                  i_2._2_1_ = IVar8 != 0;
                                  bVar4 = QTest::qCompare<bool,bool>
                                                    ((bool *)((long)&i_2 + 3),
                                                     (bool *)((long)&i_2 + 2),"proxy.commitColumn()"
                                                     ,
                                                  "bool(insertDirection & InsertProxyModel::InsertColumn)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x17e);
                                  if (((bVar4 ^ 0xffU) & 1) == 0) {
                                    j_3 = 0;
                                    while( true ) {
                                      iVar7 = j_3;
                                      iVar9 = local_23c + 1;
                                      local_8e8 = (Int)QFlags<InsertProxyModel::InsertDirection>::
                                                       operator&(&stack0xffffffffffffff24,InsertRow)
                                      ;
                                      IVar8 = QFlags::operator_cast_to_unsigned_int
                                                        ((QFlags *)&local_8e8);
                                      if ((int)(iVar9 + (uint)(IVar8 != 0)) <= iVar7) break;
                                      local_8ec = 0;
                                      while( true ) {
                                        iVar2 = local_21c;
                                        iVar7 = local_8ec;
                                        local_8f0 = (Int)QFlags<InsertProxyModel::InsertDirection>::
                                                         operator&(&stack0xffffffffffffff24,
                                                                   InsertColumn);
                                        IVar8 = QFlags::operator_cast_to_unsigned_int
                                                          ((QFlags *)&local_8f0);
                                        iVar9 = j_3;
                                        if ((int)(iVar2 + (uint)(IVar8 != 0)) <= iVar7) break;
                                        QModelIndex::QModelIndex(&local_940);
                                        InsertProxyModel::index
                                                  ((int)&local_928,(int)local_100,
                                                   (QModelIndex *)(ulong)(uint)iVar9);
                                        QModelIndex::data(&local_910,&local_928,0);
                                        pQVar3 = _indexToInsert;
                                        iVar9 = j_3;
                                        iVar7 = local_8ec;
                                        QModelIndex::QModelIndex(&local_990);
                                        (**(code **)(*(long *)pQVar3 + 0x60))
                                                  (&local_978,pQVar3,iVar9,iVar7,&local_990);
                                        QModelIndex::data(&local_960,&local_978,0);
                                        bVar4 = QTest::qCompare<QVariant,QVariant>
                                                          (&local_910,&local_960,
                                                           "proxy.index(i, j).data()",
                                                           "baseModel->index(i, j).data()",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x181);
                                        QVariant::~QVariant(&local_960);
                                        QVariant::~QVariant(&local_910);
                                        if (((bVar4 ^ 0xffU) & 1) != 0) {
                                          baseRowsInsertedSpy._124_4_ = 1;
                                          goto LAB_00114b9a;
                                        }
                                        local_8ec = local_8ec + 1;
                                      }
                                      j_3 = j_3 + 1;
                                    }
                                    local_994 = (Int)QFlags<InsertProxyModel::InsertDirection>::
                                                     operator&(&stack0xffffffffffffff24,InsertRow);
                                    IVar8 = QFlags::operator_cast_to_unsigned_int
                                                      ((QFlags *)&local_994);
                                    pQVar3 = _indexToInsert;
                                    if (IVar8 != 0) {
                                      iVar7 = local_23c + 1;
                                      QModelIndex::QModelIndex(&local_a00);
                                      (**(code **)(*(long *)pQVar3 + 0x60))
                                                (&local_9e8,pQVar3,iVar7,0,&local_a00);
                                      QModelIndex::data(&local_9d0,&local_9e8,0);
                                      QVariant::toString();
                                      QArrayDataPointer<char16_t>::QArrayDataPointer
                                                ((QArrayDataPointer<char16_t> *)local_a30,
                                                 (Data *)0x0,L"TestRow",7);
                                      QString::QString(&local_a18,(DataPointer *)local_a30);
                                      bVar4 = QTest::qCompare(&local_9b0,&local_a18,
                                                                                                                            
                                                  "baseModel->index(originalRowCount + 1, 0).data().toString()"
                                                  ,"QStringLiteral(\"TestRow\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x185);
                                      QString::~QString(&local_a18);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                ((QArrayDataPointer<char16_t> *)local_a30);
                                      QString::~QString(&local_9b0);
                                      QVariant::~QVariant(&local_9d0);
                                      if (((bVar4 ^ 0xffU) & 1) != 0) {
                                        baseRowsInsertedSpy._124_4_ = 1;
                                        goto LAB_00114b9a;
                                      }
                                      local_a34 = 0;
                                      while( true ) {
                                        iVar7 = local_a34;
                                        QModelIndex::QModelIndex(&local_a50);
                                        iVar9 = InsertProxyModel::columnCount
                                                          ((QModelIndex *)local_100);
                                        pQVar3 = _indexToInsert;
                                        if (iVar9 <= iVar7) break;
                                        QModelIndex::QModelIndex(&local_aa0);
                                        uVar10 = (**(code **)(*(long *)pQVar3 + 0x78))
                                                           (pQVar3,&local_aa0);
                                        QModelIndex::QModelIndex(&local_ab8);
                                        InsertProxyModel::index
                                                  ((int)&local_a88,(int)local_100,
                                                   (QModelIndex *)(ulong)uVar10);
                                        QModelIndex::data(&local_a70,&local_a88,0);
                                        QVariant::QVariant(&local_ad8);
                                        bVar4 = QTest::qCompare<QVariant,QVariant>
                                                          (&local_a70,&local_ad8,
                                                                                                                      
                                                  "proxy.index(baseModel->rowCount(), i).data()",
                                                  "QVariant()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x187);
                                        QVariant::~QVariant(&local_ad8);
                                        QVariant::~QVariant(&local_a70);
                                        if (((bVar4 ^ 0xffU) & 1) != 0) {
                                          baseRowsInsertedSpy._124_4_ = 1;
                                          goto LAB_00114b9a;
                                        }
                                        local_a34 = local_a34 + 1;
                                      }
                                    }
                                    local_adc = (Int)QFlags<InsertProxyModel::InsertDirection>::
                                                     operator&(&stack0xffffffffffffff24,InsertColumn
                                                              );
                                    IVar8 = QFlags::operator_cast_to_unsigned_int
                                                      ((QFlags *)&local_adc);
                                    pQVar3 = _indexToInsert;
                                    iVar7 = local_21c;
                                    if (IVar8 != 0) {
                                      if ((int)uVar1 < (int)local_23c) {
                                        QModelIndex::QModelIndex(&local_b48);
                                        (**(code **)(*(long *)pQVar3 + 0x60))
                                                  (&local_b30,pQVar3,uVar1 + 1,iVar7,&local_b48);
                                        QModelIndex::data(&local_b18,&local_b30,0);
                                        QVariant::toString();
                                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                                  (&local_b78,(Data *)0x0,L"TestColumnAfter",0xf);
                                        QString::QString(&local_b60,&local_b78);
                                        bVar4 = QTest::qCompare(&local_af8,&local_b60,
                                                                                                                                
                                                  "baseModel->index(indexToInsert + 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnAfter\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x18b);
                                        QString::~QString(&local_b60);
                                        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b78);
                                        QString::~QString(&local_af8);
                                        QVariant::~QVariant(&local_b18);
                                        if (((bVar4 ^ 0xffU) & 1) != 0) {
                                          baseRowsInsertedSpy._124_4_ = 1;
                                          goto LAB_00114b9a;
                                        }
                                      }
                                      pQVar3 = _indexToInsert;
                                      iVar7 = local_21c;
                                      if (0 < (int)uVar1) {
                                        QModelIndex::QModelIndex(&local_be0);
                                        (**(code **)(*(long *)pQVar3 + 0x60))
                                                  (&local_bc8,pQVar3,uVar1 - 1,iVar7,&local_be0);
                                        QModelIndex::data(&local_bb0,&local_bc8,0);
                                        QVariant::toString();
                                        QArrayDataPointer<char16_t>::QArrayDataPointer
                                                  ((QArrayDataPointer<char16_t> *)local_c10,
                                                   (Data *)0x0,L"TestColumnBefore",0x10);
                                        QString::QString(&local_bf8,(DataPointer *)local_c10);
                                        bVar4 = QTest::qCompare(&local_b90,&local_bf8,
                                                                                                                                
                                                  "baseModel->index(indexToInsert - 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnBefore\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x18d);
                                        QString::~QString(&local_bf8);
                                        QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                  ((QArrayDataPointer<char16_t> *)local_c10);
                                        QString::~QString(&local_b90);
                                        QVariant::~QVariant(&local_bb0);
                                        if (((bVar4 ^ 0xffU) & 1) != 0) {
                                          baseRowsInsertedSpy._124_4_ = 1;
                                          goto LAB_00114b9a;
                                        }
                                      }
                                      local_c14 = 0;
                                      while( true ) {
                                        uVar1 = local_c14;
                                        QModelIndex::QModelIndex(&local_c30);
                                        iVar7 = InsertProxyModel::rowCount((QModelIndex *)local_100)
                                        ;
                                        pQVar3 = _indexToInsert;
                                        uVar10 = local_c14;
                                        if (iVar7 <= (int)uVar1) break;
                                        QModelIndex::QModelIndex(&local_c80);
                                        (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&local_c80);
                                        QModelIndex::QModelIndex(&local_c98);
                                        InsertProxyModel::index
                                                  ((int)&local_c68,(int)local_100,
                                                   (QModelIndex *)(ulong)uVar10);
                                        QModelIndex::data(&local_c50,&local_c68,0);
                                        QVariant::QVariant(&local_cb8);
                                        bVar4 = QTest::qCompare<QVariant,QVariant>
                                                          (&local_c50,&local_cb8,
                                                                                                                      
                                                  "proxy.index(i, baseModel->columnCount()).data()",
                                                  "QVariant()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,399);
                                        QVariant::~QVariant(&local_cb8);
                                        QVariant::~QVariant(&local_c50);
                                        if (((bVar4 ^ 0xffU) & 1) != 0) {
                                          baseRowsInsertedSpy._124_4_ = 1;
                                          goto LAB_00114b9a;
                                        }
                                        local_c14 = local_c14 + 1;
                                      }
                                    }
                                    QObject::deleteLater();
                                    baseRowsInsertedSpy._124_4_ = 0;
                                  }
                                  else {
                                    baseRowsInsertedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  baseRowsInsertedSpy._124_4_ = 1;
                                }
                              }
                              else {
                                baseRowsInsertedSpy._124_4_ = 1;
                              }
                            }
                            else {
                              baseRowsInsertedSpy._124_4_ = 1;
                            }
                          }
                          else {
                            baseRowsInsertedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          baseRowsInsertedSpy._124_4_ = 1;
                        }
                      }
                      else {
                        baseRowsInsertedSpy._124_4_ = 1;
                      }
                    }
                    else {
                      baseRowsInsertedSpy._124_4_ = 1;
                    }
                  }
                  else {
                    baseRowsInsertedSpy._124_4_ = 1;
                  }
LAB_00114b9a:
                  QList<QVariant>::~QList((QList<QVariant> *)local_560);
                }
                else {
                  baseRowsInsertedSpy._124_4_ = 1;
                }
              }
              else {
                baseRowsInsertedSpy._124_4_ = 1;
              }
            }
            else {
              baseRowsInsertedSpy._124_4_ = 1;
            }
          }
        }
        else {
          QModelIndex::QModelIndex(&local_2c8);
          InsertProxyModel::index((int)local_2b0,(int)local_100,(QModelIndex *)(ulong)uVar10);
          QArrayDataPointer<char16_t>::QArrayDataPointer(&local_318,(Data *)0x0,L"TestRow",7);
          QString::QString(&local_300,&local_318);
          QVariant::QVariant(&local_2e8,&local_300);
          bVar5 = InsertProxyModel::setData
                            ((QModelIndex *)local_100,(QVariant *)local_2b0,(int)&local_2e8);
          bVar5 = QTest::qVerify((bool)(bVar5 & 1),
                                 "proxy.setData(proxy.index(originalRowCount, 0), QStringLiteral(\"TestRow\"))"
                                 ,"",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                 ,0x150);
          QVariant::~QVariant(&local_2e8);
          QString::~QString(&local_300);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_318);
          if (((bVar5 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_330);
            iVar7 = InsertProxyModel::rowCount((QModelIndex *)local_100);
            QModelIndex::QModelIndex(&local_348);
            bVar4 = QAbstractItemModel::insertRow((QAbstractItemModel *)local_100,iVar7,&local_348);
            bVar5 = QTest::qVerify((bool)(~bVar4 & 1),"!proxy.insertRow(proxy.rowCount())","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x151);
            if (((bVar5 ^ 0xff) & 1) == 0) goto LAB_001127fc;
            baseRowsInsertedSpy._124_4_ = 1;
          }
          else {
            baseRowsInsertedSpy._124_4_ = 1;
          }
        }
      }
      else {
        baseRowsInsertedSpy._124_4_ = 1;
      }
    }
    else {
      baseRowsInsertedSpy._124_4_ = 1;
    }
  }
LAB_00114ba6:
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_218);
LAB_00114bb2:
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_190);
  InsertProxyModel::~InsertProxyModel(local_100);
  return;
}

Assistant:

void tst_InsertProxyModel::testSourceInsertRow()
{
    QFETCH(QAbstractItemModel *, baseModel);
    QFETCH(InsertProxyModel::InsertDirections, insertDirection);
    QFETCH(int, indexToInsert);
    QFETCH(bool, addViaProxy);
    InsertProxyModel proxy;
    new ModelTest(&proxy, baseModel);
    proxy.setSourceModel(baseModel);
    proxy.setInsertDirection(insertDirection);
    QSignalSpy proxyRowsInsertedSpy(&proxy, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsInsertedSpy.isValid());
    QSignalSpy baseRowsInsertedSpy(baseModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(baseRowsInsertedSpy.isValid());
    const int originalColCount = baseModel->columnCount();
    const int originalRowCount = baseModel->rowCount();
    QCOMPARE(proxy.rowCount(), originalRowCount + bool(insertDirection & InsertProxyModel::InsertRow));
    QCOMPARE(proxy.columnCount(), originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn));
    if (insertDirection & InsertProxyModel::InsertRow) {
        QVERIFY(proxy.setData(proxy.index(originalRowCount, 0), QStringLiteral("TestRow")));
        QVERIFY(!proxy.insertRow(proxy.rowCount()));
    }
    if (insertDirection & InsertProxyModel::InsertColumn) {
        if (indexToInsert > 0)
            QVERIFY(proxy.setData(proxy.index(indexToInsert - 1, originalColCount), QStringLiteral("TestColumnBefore")));
        if (indexToInsert < originalRowCount)
            QVERIFY(proxy.setData(proxy.index(indexToInsert, originalColCount), QStringLiteral("TestColumnAfter")));
    }
    for (int i = 0; i < originalRowCount; ++i) {
        for (int j = 0; j < originalColCount; ++j) {
            QCOMPARE(proxy.index(i, j).data(), baseModel->index(i, j).data());
        }
    }
    if (addViaProxy)
        QVERIFY(proxy.insertRow(indexToInsert));
    else
        QVERIFY(baseModel->insertRow(indexToInsert));
    QCOMPARE(baseRowsInsertedSpy.count(), 1);
    baseRowsInsertedSpy.clear();
    QCOMPARE(proxyRowsInsertedSpy.count(), 1);
    const auto args = proxyRowsInsertedSpy.value(0);
    proxyRowsInsertedSpy.clear();
    QVERIFY(!args.value(0).value<QModelIndex>().isValid());
    QCOMPARE(args.value(1).toInt(), indexToInsert);
    QCOMPARE(args.value(2).toInt(), indexToInsert);
    QCOMPARE(baseModel->rowCount(), originalRowCount + 1);
    QCOMPARE(baseModel->columnCount(), originalColCount);
    QCOMPARE(proxy.rowCount(), originalRowCount + 1 + bool(insertDirection & InsertProxyModel::InsertRow));
    QCOMPARE(proxy.columnCount(), originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn));
    for (int i = 0; i < originalRowCount + 1; ++i) {
        for (int j = 0; j < originalColCount; ++j) {
            QCOMPARE(proxy.index(i, j).data(), baseModel->index(i, j).data());
        }
    }
    for (int j = 0; j < originalColCount; ++j) {
        QVERIFY(proxy.index(indexToInsert, j).data().isNull());
        QVERIFY(baseModel->index(indexToInsert, j).data().isNull());
    }
    if (insertDirection & InsertProxyModel::InsertColumn) {
        if (indexToInsert < originalRowCount)
            QCOMPARE(proxy.index(indexToInsert + 1, originalColCount).data().toString(), QStringLiteral("TestColumnAfter"));
        if (indexToInsert > 0)
            QCOMPARE(proxy.index(indexToInsert - 1, originalColCount).data().toString(), QStringLiteral("TestColumnBefore"));
    }
    QCOMPARE(proxy.commitRow(), bool(insertDirection & InsertProxyModel::InsertRow));
    QCOMPARE(proxy.commitColumn(), bool(insertDirection & InsertProxyModel::InsertColumn));
    for (int i = 0; i < originalRowCount + 1 + bool(insertDirection & InsertProxyModel::InsertRow); ++i) {
        for (int j = 0; j < originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn); ++j) {
            QCOMPARE(proxy.index(i, j).data(), baseModel->index(i, j).data());
        }
    }
    if (insertDirection & InsertProxyModel::InsertRow) {
        QCOMPARE(baseModel->index(originalRowCount + 1, 0).data().toString(), QStringLiteral("TestRow"));
        for (int i = 0; i < proxy.columnCount(); ++i)
            QCOMPARE(proxy.index(baseModel->rowCount(), i).data(), QVariant());
    }
    if (insertDirection & InsertProxyModel::InsertColumn) {
        if (indexToInsert < originalRowCount)
            QCOMPARE(baseModel->index(indexToInsert + 1, originalColCount).data().toString(), QStringLiteral("TestColumnAfter"));
        if (indexToInsert > 0)
            QCOMPARE(baseModel->index(indexToInsert - 1, originalColCount).data().toString(), QStringLiteral("TestColumnBefore"));
        for (int i = 0; i < proxy.rowCount(); ++i)
            QCOMPARE(proxy.index(i, baseModel->columnCount()).data(), QVariant());
    }
    baseModel->deleteLater();
}